

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::(anonymous_namespace)::ExpandWithIndices<std::array<unsigned_int,2ul>>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
          *values,uint32_t elementSize,vector<int,_std::allocator<int>_> *indices,
          vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
          *dest)

{
  uint uVar1;
  value_type_conflict vVar2;
  undefined4 in_register_0000000c;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  long local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> invalidIndices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  plVar3 = (long *)CONCAT44(in_register_0000000c,elementSize);
  if (indices == (vector<int,_std::allocator<int>_> *)0x0) {
    local_b0.m_error._M_dataplus._M_p = "`dest` is nullptr.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_b0);
  }
  else if (*plVar3 == plVar3[1]) {
    ::std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
    operator=((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               *)indices,
              (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               *)this);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = true;
  }
  else if (((int)values == 0) ||
          (uVar5 = (ulong)values & 0xffffffff,
          (ulong)(*(long *)(this + 8) - *(long *)this >> 3) % uVar5 != 0)) {
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = false;
  }
  else {
    ::std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
    resize((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> *
           )indices,(plVar3[1] - *plVar3 >> 2) * uVar5);
    invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90 = uVar5 * 8;
    vVar2 = true;
    local_b0.m_error._M_dataplus._M_p = (pointer)0x0;
    while( true ) {
      if ((undefined1 *)(plVar3[1] - *plVar3 >> 2) <= local_b0.m_error._M_dataplus._M_p) break;
      uVar1 = *(uint *)(*plVar3 + (long)local_b0.m_error._M_dataplus._M_p * 4);
      if (((int)uVar1 < 0) ||
         (uVar4 = ((ulong)uVar1 + 1) * uVar5, uVar6 = *(long *)(this + 8) - *(long *)this >> 3,
         uVar6 <= uVar4 && uVar4 - uVar6 != 0)) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&invalidIndices,(value_type_conflict3 *)&local_b0);
        vVar2 = false;
      }
      else {
        for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
          *(undefined8 *)
           ((indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start + (long)local_b0.m_error._M_dataplus._M_p * uVar5 * 2 + uVar4 * 2) =
               *(undefined8 *)(*(long *)this + (ulong)uVar1 * local_90 + uVar4 * 8);
        }
      }
      local_b0.m_error._M_dataplus._M_p = local_b0.m_error._M_dataplus._M_p + 1;
    }
    if (invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = vVar2;
    }
    else {
      tinyusdz::value::print_array_snipped<unsigned_long>(&local_50,&invalidIndices,5);
      ::std::operator+(&local_70,"Invalid indices found: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_50);
      local_b0.m_error._M_dataplus._M_p = (pointer)&local_b0.m_error.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        local_b0.m_error.field_2._8_8_ = local_70.field_2._8_8_;
      }
      else {
        local_b0.m_error._M_dataplus._M_p = local_70._M_dataplus._M_p;
      }
      local_b0.m_error._M_string_length = local_70._M_string_length;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,&local_b0);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> ExpandWithIndices(
    const std::vector<T> &values, uint32_t elementSize, const std::vector<int32_t> &indices,
    std::vector<T> *dest) {
  if (!dest) {
    return nonstd::make_unexpected("`dest` is nullptr.");
  }

  if (indices.empty()) {
    (*dest) = values;
    return true;
  }

  if (elementSize == 0) {
    return false;
  }

  if ((values.size() % elementSize) != 0) {
    return false;
  }

  dest->resize(indices.size() * elementSize);

  std::vector<size_t> invalidIndices;

  bool valid = true;
  for (size_t i = 0; i < indices.size(); i++) {
    int32_t idx = indices[i];
    if ((idx >= 0) && ((size_t(idx+1) * size_t(elementSize)) <= values.size())) {
      for (size_t k = 0; k < elementSize; k++) {
        (*dest)[i*elementSize + k] = values[size_t(idx)*elementSize + k];
      }
    } else {
      invalidIndices.push_back(i);
      valid = false;
    }
  }

  if (invalidIndices.size()) {
    return nonstd::make_unexpected(
        "Invalid indices found: " +
        value::print_array_snipped(invalidIndices,
                                   /* N to display */ 5));
  }

  return valid;
}